

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-moduled-compress.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  size_t file_size;
  bool bVar1;
  char *local_68;
  undefined1 local_60 [8];
  KosinskiCompressCallbacks callbacks;
  FILE *out_file;
  char *out_filename;
  unsigned_long in_size;
  FILE *in_file;
  int exit_code;
  char **argv_local;
  int argc_local;
  
  in_file._4_4_ = 0;
  if (argc < 2) {
    fputs("This tool compresses a supplied file in the Moduled Kosinski format. It tries to produce files accurate to Sega\'s original compressor.\n\nwww.github.com/Clownacy/accurate-kosinski\n\nUsage: kosinskim-compress [in_file] [out_file](optional)\n"
          ,_stdout);
  }
  else {
    __stream = fopen(argv[1],"rb");
    if (__stream == (FILE *)0x0) {
      in_file._4_4_ = 1;
      printf("Could not open \'%s\'\n",argv[1]);
    }
    else {
      fseek(__stream,0,2);
      file_size = ftell(__stream);
      rewind(__stream);
      fprintf(_stderr,"File \'%s\' with size %lX loaded\n",argv[1],file_size);
      if (argc < 3) {
        local_68 = "out.kosm";
      }
      else {
        local_68 = argv[2];
      }
      callbacks.write_byte = (_func_void_void_ptr_uint *)fopen(local_68,"wb");
      bVar1 = (FILE *)callbacks.write_byte != (FILE *)0x0;
      if (bVar1) {
        callbacks.read_byte_user_data = ReadByte;
        callbacks.write_byte_user_data = WriteByte;
        local_60 = (undefined1  [8])__stream;
        callbacks.read_byte = (_func_uint_void_ptr *)callbacks.write_byte;
        KosinskiCompressModuled(file_size,(KosinskiCompressCallbacks *)local_60,'\x01');
        fclose((FILE *)callbacks.write_byte);
      }
      else {
        fprintf(_stderr,"Could not open \'%s\'\n",local_68);
      }
      in_file._4_4_ = (uint)!bVar1;
      fclose(__stream);
    }
  }
  return in_file._4_4_;
}

Assistant:

int main(const int argc, char** const argv)
{
	int exit_code = EXIT_SUCCESS;

	if (argc < 2)
	{
		fputs(
			"This tool compresses a supplied file in the Moduled Kosinski format. It tries to produce files accurate to Sega's original compressor.\n"
			"\n"
			"www.github.com/Clownacy/accurate-kosinski\n"
			"\n"
			"Usage: kosinskim-compress [in_file] [out_file](optional)\n"
			, stdout
		);
	}
	else
	{
		FILE* const in_file = fopen(argv[1], "rb");

		if (in_file == NULL)
		{
			exit_code = EXIT_FAILURE;
			printf("Could not open '%s'\n", argv[1]);
		}
		else
		{
			unsigned long in_size;
			const char *out_filename;
			FILE *out_file;

			fseek(in_file, 0, SEEK_END);
			in_size = ftell(in_file);
			rewind(in_file);

		#ifdef DEBUG
			fprintf(stderr, "File '%s' with size %lX loaded\n", argv[1], in_size);
		#endif

			out_filename = (argc > 2) ? argv[2] : "out.kosm";
			out_file = fopen(out_filename, "wb");

			if (out_file == NULL)
			{
				exit_code = EXIT_FAILURE;
				fprintf(stderr, "Could not open '%s'\n", out_filename);
			}
			else
			{
				KosinskiCompressCallbacks callbacks;
				callbacks.read_byte_user_data = in_file;
				callbacks.read_byte = ReadByte;
				callbacks.write_byte_user_data = out_file;
				callbacks.write_byte = WriteByte;

				KosinskiCompressModuled(in_size, &callbacks,
				#ifdef DEBUG
					cc_true
				#else
					cc_false
				#endif
				);

				fclose(out_file);
			}

			fclose(in_file);
		}
	}

	return exit_code;
}